

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O0

void reportInfo(FILE *file,InfoRecordInt64 *info,HighsFileType file_type)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int in_EDX;
  long in_RSI;
  FILE *in_RDI;
  string local_a8 [32];
  string *in_stack_ffffffffffffff78;
  string local_58 [32];
  string local_38 [40];
  long local_10;
  
  local_10 = in_RSI;
  if (in_EDX == 4) {
    std::__cxx11::string::string(local_58,(string *)(in_RSI + 0x10));
    highsInsertMdEscapes(in_stack_ffffffffffffff78);
    uVar1 = std::__cxx11::string::c_str();
    std::__cxx11::string::string(local_a8,(string *)(local_10 + 0x30));
    highsInsertMdEscapes(in_stack_ffffffffffffff78);
    uVar2 = std::__cxx11::string::c_str();
    fprintf(in_RDI,"## %s\n- %s\n- Type: long integer\n\n",uVar1,uVar2);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string(local_58);
  }
  else if (in_EDX == 1) {
    uVar1 = std::__cxx11::string::c_str();
    uVar2 = std::__cxx11::string::c_str();
    fprintf(in_RDI,"\n# %s\n# [type: int64_t]\n%s = %ld\n",uVar1,uVar2,
            **(undefined8 **)(local_10 + 0x58));
  }
  else {
    uVar1 = std::__cxx11::string::c_str();
    fprintf(in_RDI,"%-30s = %ld\n",uVar1,**(undefined8 **)(local_10 + 0x58));
  }
  return;
}

Assistant:

void reportInfo(FILE* file, const InfoRecordInt64& info,
                const HighsFileType file_type) {
  if (file_type == HighsFileType::kMd) {
    fprintf(file, "## %s\n- %s\n- Type: long integer\n\n",
            highsInsertMdEscapes(info.name).c_str(),
            highsInsertMdEscapes(info.description).c_str());
  } else if (file_type == HighsFileType::kFull) {
    fprintf(file, "\n# %s\n# [type: int64_t]\n%s = %" PRId64 "\n",
            info.description.c_str(), info.name.c_str(), *info.value);
  } else {
    fprintf(file, "%-30s = %" PRId64 "\n", info.name.c_str(), *info.value);
  }
}